

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Sequence::Setup(ChFunction_Sequence *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _List_node_base *p_Var3;
  element_type *this_00;
  list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *plVar4;
  ChFunction_Fillet3 *this_01;
  _List_node_base *p_Var5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  shared_ptr<chrono::ChFunction_Fillet3> mfillet;
  shared_ptr<chrono::ChFunction> local_60;
  double local_50;
  double local_48;
  double local_40;
  _List_node_base *local_38;
  
  local_38 = (_List_node_base *)this->start;
  plVar4 = &this->functions;
  local_40 = 0.0;
  local_50 = 0.0;
  local_48 = 0.0;
  p_Var5 = (_List_node_base *)plVar4;
  while (p_Var5 = (((_List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *)
                   &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)plVar4) {
    p_Var5[3]._M_next = local_38;
    p_Var3 = p_Var5 + 1;
    p_Var5[3]._M_prev = (_List_node_base *)((double)local_38 + *(double *)(p_Var5 + 1 + 1));
    p_Var5[5]._M_next = (_List_node_base *)0x0;
    p_Var5[4]._M_next = (_List_node_base *)0x0;
    p_Var5[4]._M_prev = (_List_node_base *)0x0;
    std::dynamic_pointer_cast<chrono::ChFunction_Fillet3,chrono::ChFunction>(&local_60);
    if ((ChFunction_Fillet3 *)
        local_60.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (ChFunction_Fillet3 *)0x0) {
      if (*(char *)&p_Var5[5]._M_prev == '\x01') {
        dVar6 = (double)(**(code **)(*(long *)p_Var3->_M_next + 0x20))(0);
        p_Var5[4]._M_next = (_List_node_base *)(local_48 - dVar6);
      }
      if (*(undefined1 *)((long)&p_Var5[5]._M_prev + 1) == '\x01') {
        dVar6 = (double)(**(code **)(*(long *)p_Var3->_M_next + 0x28))(0);
        p_Var5[4]._M_prev = (_List_node_base *)(local_50 - dVar6);
      }
      if (*(undefined1 *)((long)&p_Var5[5]._M_prev + 2) == '\x01') {
        dVar6 = (double)(**(code **)(*(long *)p_Var3->_M_next + 0x30))(0);
        p_Var5[5]._M_next = (_List_node_base *)(local_40 - dVar6);
      }
    }
    else {
      *(double *)
       ((long)local_60.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
       0x10) = local_48;
      ChFunction_Fillet3::SetupCoefficients
                ((ChFunction_Fillet3 *)
                 local_60.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      *(double *)
       ((long)local_60.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
       0x20) = local_50;
      ChFunction_Fillet3::SetupCoefficients
                ((ChFunction_Fillet3 *)
                 local_60.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      this_00 = local_60.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var3 = p_Var5->_M_next;
      if (p_Var3 == (_List_node_base *)plVar4) {
        *(double *)
         ((long)local_60.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
         0x18) = 0.0;
        ChFunction_Fillet3::SetupCoefficients
                  ((ChFunction_Fillet3 *)
                   local_60.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        dVar6 = 0.0;
        this_01 = (ChFunction_Fillet3 *)
                  local_60.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
      }
      else {
        dVar6 = (double)(**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x20))(0);
        *(double *)((long)this_00 + 0x18) = dVar6;
        ChFunction_Fillet3::SetupCoefficients((ChFunction_Fillet3 *)this_00);
        this_01 = (ChFunction_Fillet3 *)
                  local_60.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        dVar6 = (double)(**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x28))(0);
      }
      this_01->dy2 = dVar6;
      ChFunction_Fillet3::SetupCoefficients(this_01);
      ChFunction_Fillet3::Set_end
                ((ChFunction_Fillet3 *)
                 local_60.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 *(double *)(p_Var5 + 1 + 1));
      p_Var5[5]._M_next = (_List_node_base *)0x0;
      p_Var5[4]._M_next = (_List_node_base *)0x0;
      p_Var5[4]._M_prev = (_List_node_base *)0x0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    dVar6 = (double)(**(code **)(*(long *)p_Var5[1]._M_next + 0x20))((p_Var5 + 1)[1]._M_next);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(double *)(p_Var5 + 1 + 1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = p_Var5[4]._M_prev;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar6 + (double)p_Var5[4]._M_next;
    auVar1 = vfmadd231sd_fma(auVar9,auVar7,auVar1);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(double *)(p_Var5 + 1 + 1) * (double)p_Var5[5]._M_next;
    auVar1 = vfmadd213sd_fma(auVar11,auVar7,auVar1);
    local_48 = auVar1._0_8_;
    dVar6 = (double)(**(code **)(*(long *)p_Var5[1]._M_next + 0x28))();
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)(p_Var5 + 1 + 1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = p_Var5[5]._M_next;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar6 + (double)p_Var5[4]._M_prev;
    auVar1 = vfmadd231sd_fma(auVar10,auVar8,auVar2);
    local_50 = auVar1._0_8_;
    local_40 = (double)(**(code **)(*(long *)p_Var5[1]._M_next + 0x30))();
    local_40 = local_40 + (double)p_Var5[5]._M_next;
    local_38 = (_List_node_base *)((double)local_38 + *(double *)(p_Var5 + 1 + 1));
  }
  return;
}

Assistant:

void ChFunction_Sequence::Setup() {
    double basetime = this->start;
    double lastIy = 0;
    double lastIy_dt = 0;
    double lastIy_dtdt = 0;

    std::list<ChFseqNode>::iterator iter_next;
    for (auto iter = functions.begin(); iter != functions.end(); ++iter) {
        iter->t_start = basetime;
        iter->t_end = basetime + iter->duration;
        iter->Iy = 0;
        iter->Iydt = 0;
        iter->Iydtdt = 0;

        if (auto mfillet = std::dynamic_pointer_cast<ChFunction_Fillet3>(iter->fx)) {
            mfillet->Set_y1(lastIy);
            mfillet->Set_dy1(lastIy_dt);

            iter_next = iter;
            ++iter_next;
            if (iter_next != functions.end()) {
                mfillet->Set_y2(iter_next->fx->Get_y(0));
                mfillet->Set_dy2(iter_next->fx->Get_y_dx(0));
            } else {
                mfillet->Set_y2(0);
                mfillet->Set_dy2(0);
            }
            mfillet->Set_end(iter->duration);
            iter->Iy = iter->Iydt = iter->Iydtdt = 0;
        } else  // generic continuity conditions
        {
            if (iter->y_cont)
                iter->Iy = lastIy - iter->fx->Get_y(0);
            if (iter->ydt_cont)
                iter->Iydt = lastIy_dt - iter->fx->Get_y_dx(0);
            if (iter->ydtdt_cont)
                iter->Iydtdt = lastIy_dtdt - iter->fx->Get_y_dxdx(0);
        }

        lastIy = iter->fx->Get_y(iter->duration) + iter->Iy + iter->Iydt * iter->duration +
                 iter->Iydtdt * iter->duration * iter->duration;
        lastIy_dt = iter->fx->Get_y_dx(iter->duration) + iter->Iydt + iter->Iydtdt * iter->duration;
        lastIy_dtdt = iter->fx->Get_y_dxdx(iter->duration) + iter->Iydtdt;

        basetime += iter->duration;
    }
}